

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O0

QString * qt_ACE_do(QString *domain,AceOperation op,AceLeadingDot dot,AceProcessingOptions options)

{
  QStringView normalizedDomain;
  QStringView normalizedDomain_00;
  bool bVar1;
  undefined1 uVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QStringView *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QFlagsStorage<QUrl::AceProcessingOption> in_stack_00000058;
  QString aceResult;
  bool needsConversionToUnicode;
  QString normalized;
  QString mapped;
  bool mappedToAscii;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  QStringView *this;
  UnicodeVersion in_stack_ffffffffffffff40;
  NormalizationForm in_stack_ffffffffffffff44;
  QStringView *usesPunycode;
  AceLeadingDot in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff90;
  storage_type_conflict *psVar3;
  undefined8 in_stack_ffffffffffffffa8;
  QFlagsStorage<QUrl::AceProcessingOption> options_00;
  undefined4 in_stack_ffffffffffffffd0;
  storage_type_conflict *psVar4;
  long lVar5;
  
  options_00.i = (Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  usesPunycode = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x30e3ed);
  if (bVar1) {
    QString::QString((QString *)0x30e3fd);
    goto LAB_0030e773;
  }
  psVar4 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  mapDomainName((QString *)&DAT_aaaaaaaaaaaaaaaa,(AceProcessingOptions)in_stack_00000058.i,
                (bool *)&DAT_aaaaaaaaaaaaaaaa);
  QString::normalized((QString *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffff44,
                      in_stack_ffffffffffffff40);
  bVar1 = QString::isEmpty((QString *)0x30e4e1);
  if (bVar1) {
    QString::QString((QString *)0x30e4f1);
  }
  else {
    uVar2 = checkUnicodeName(in_stack_ffffffffffffff70,(AceProcessingOptions)options_00.i);
    if ((bool)uVar2) {
      psVar3 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      QStringView::QStringView<QString,_true>(this,(QString *)in_RDI);
      normalizedDomain_00.m_size._4_4_ = in_R8D;
      normalizedDomain_00.m_size._0_4_ = in_stack_ffffffffffffffd0;
      normalizedDomain_00.m_data = psVar4;
      convertToAscii(normalizedDomain_00,(AceLeadingDot)((ulong)usesPunycode >> 0x20));
      bVar1 = QString::isEmpty((QString *)0x30e613);
      if (bVar1) {
LAB_0030e654:
        QString::QString((QString *)0x30e65e);
      }
      else {
        QStringView::QStringView<QString,_true>(this,(QString *)in_RDI);
        normalizedDomain.m_data = psVar3;
        normalizedDomain.m_size = in_stack_ffffffffffffff90;
        bVar1 = checkAsciiDomainName
                          (normalizedDomain,in_stack_ffffffffffffff60,(bool *)usesPunycode);
        if (!bVar1) goto LAB_0030e654;
        QString::QString((QString *)
                         CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffff25,
                                                                in_stack_ffffffffffffff20))),
                         (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      QString::~QString((QString *)0x30e73b);
    }
    else {
      QString::QString((QString *)0x30e55b);
    }
  }
  QString::~QString((QString *)0x30e748);
  QString::~QString((QString *)0x30e755);
LAB_0030e773:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return (QString *)this;
}

Assistant:

QString qt_ACE_do(const QString &domain, AceOperation op, AceLeadingDot dot,
                  QUrl::AceProcessingOptions options)
{
    if (domain.isEmpty())
        return {};

    bool mappedToAscii;
    const QString mapped = mapDomainName(domain, options, &mappedToAscii);
    const QString normalized =
            mappedToAscii ? mapped : mapped.normalized(QString::NormalizationForm_C);

    if (normalized.isEmpty())
        return {};

    if (!mappedToAscii && !checkUnicodeName(normalized, options))
        return {};

    bool needsConversionToUnicode;
    const QString aceResult = mappedToAscii ? normalized : convertToAscii(normalized, dot);
    if (aceResult.isEmpty() || !checkAsciiDomainName(aceResult, dot, &needsConversionToUnicode))
        return {};

    if (op == ToAceOnly || !needsConversionToUnicode
        || (!options.testFlag(QUrl::IgnoreIDNWhitelist) && !qt_is_idn_enabled(aceResult))) {
        return aceResult;
    }

    return convertToUnicode(aceResult, options);
}